

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInternalJacobians
          (ChElementShellReissner4 *this,double Kfactor,double Rfactor)

{
  pointer pLVar1;
  pointer pdVar2;
  LhsNested LVar3;
  MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *this_00;
  long lVar4;
  ChVector<double> *pCVar5;
  ulong uVar6;
  ChMatrixNM<double,_12,_24> *pCVar7;
  ChMatrixNM<double,_12,_IDOFS> *pCVar8;
  long lVar9;
  ChMatrixNM<double,_12,_12> C;
  ChMatrixNM<double,_12,_12> l_C;
  ChMatrixNM<double,_IDOFS,_IDOFS> K_beta_beta;
  ChMatrixNM<double,_IDOFS,_24> K_beta_q;
  ChMatrixNM<double,_24,_24> Km;
  ChMatrixNM<double,_24,_24> Kg;
  ChMatrixNM<double,_24,_24> Rm;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_24,_1,_12,_24>,_0>
  local_4770;
  ChMatrixNM<double,_12,_24> *local_4758;
  __shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> local_4750;
  MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *local_4740;
  double local_4738;
  long local_4730;
  double local_4728;
  ChMatrixNM<double,_12,_IDOFS> *local_4720;
  ChMatrixNM<double,_12,_24> *local_4718;
  ChVector<double> *local_4710;
  ChVector<double> *local_4708;
  ChVector<double> *local_4700;
  ChVector<double> *local_46f8;
  ChMatrixNM<double,_15,_15> *local_46f0;
  ChMatrixNM<double,_15,_24> *local_46e8;
  ChVector<double> *local_46e0;
  ChVector<double> *local_46d8;
  MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *local_46d0;
  undefined8 local_46c8;
  undefined8 local_46c0;
  undefined8 local_46b8;
  MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *local_46a8;
  undefined8 local_46a0;
  undefined8 local_4698;
  undefined8 local_4690;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>,_Eigen::Matrix<double,_15,_15,_1,_15,_15>,_0>,_Eigen::Matrix<double,_15,_24,_1,_15,_24>,_0>
  local_4680 [48];
  DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> local_4200 [1208];
  Matrix<double,_7,_7,_1,_7,_7> local_3d48;
  Matrix<double,_7,_24,_1,_7,_24> local_3bc0;
  Matrix<double,_24,_24,_1,_24,_24> local_3680;
  Matrix<double,_24,_24,_1,_24,_24> local_2480;
  DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> local_1280 [4688];
  
  local_4740 = (MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)&this->m_JacobianMatrix;
  local_4738 = Kfactor;
  local_4728 = Rfactor;
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_4740);
  local_46f0 = this->G_i;
  local_46f8 = this->eps_tilde_1_i;
  local_46e8 = this->D_overline_i;
  local_4700 = this->eps_tilde_2_i;
  local_4708 = this->k_tilde_1_i;
  local_4710 = this->k_tilde_2_i;
  local_4718 = this->B_overline_i;
  local_4720 = this->P_i;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    local_4680[0].m_lhs.m_lhs.m_matrix = local_46e8 + lVar9;
    local_4680[0].m_lhs.m_rhs = local_46f0 + lVar9;
    local_4680[0].m_rhs = local_4680[0].m_lhs.m_lhs.m_matrix;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,15,24,1,15,24>>,Eigen::Matrix<double,15,15,1,15,15>,0>,Eigen::Matrix<double,15,24,1,15,24>,0>>
              (&local_2480,local_4680);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4680);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero(local_4200);
    local_4758 = (ChMatrixNM<double,_12,_24> *)(local_46f8 + lVar9);
    local_46d8 = local_4700 + lVar9;
    local_46e0 = local_4708 + lVar9;
    pCVar5 = local_4710 + lVar9;
    lVar4 = 0x20;
    uVar6 = 0;
    local_4730 = lVar9;
    while( true ) {
      lVar9 = local_4730;
      pLVar1 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x28) <= uVar6
         ) break;
      std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )&local_4770,
                   (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )((long)pLVar1 + lVar4 + -0x18));
      local_46a0 = 0xc;
      local_4698 = 0xc;
      local_4690 = 0xc;
      pdVar2 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_46a8 = (MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4200;
      (**(code **)((long)((local_4770.m_lhs.m_lhs.m_matrix)->
                         super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>).m_storage
                         .m_data.array[0] + 0x18))
                (pdVar2[uVar6],pdVar2[uVar6 + 1],
                 *(undefined8 *)
                  ((long)&((this->m_layers).
                           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_element + lVar4),
                 local_4770.m_lhs.m_lhs.m_matrix,&local_46a8,local_4758,local_46d8,local_46e0,pCVar5
                 ,0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4770.m_lhs.m_rhs);
      Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_4680,
                 (MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4200);
      lVar4 = lVar4 + 0x28;
      uVar6 = uVar6 + 1;
    }
    local_4770.m_lhs.m_rhs = (RhsNested)local_4680;
    pCVar7 = local_4718 + local_4730;
    local_4770.m_lhs.m_lhs.m_matrix = pCVar7;
    local_4770.m_rhs = pCVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,24,1,12,24>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,0>>
              (&local_3680,&local_4770);
    pCVar8 = local_4720 + lVar9;
    local_4770.m_lhs.m_lhs.m_matrix = (non_const_type)pCVar8;
    local_4770.m_lhs.m_rhs = (RhsNested)local_4680;
    local_4770.m_rhs = pCVar7;
    local_4758 = pCVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,7,24,1,7,24>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,7,1,12,7>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,0>>
              (&local_3bc0,
               (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_24,_1,_12,_24>,_0>
                *)&local_4770);
    local_4770.m_lhs.m_lhs.m_matrix = (non_const_type)pCVar8;
    local_4770.m_lhs.m_rhs = (RhsNested)local_4680;
    local_4770.m_rhs = (RhsNested)pCVar8;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,7,7,1,7,7>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,7,1,12,7>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,7,1,12,7>,0>>
              (&local_3d48,
               (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_7,_1,_12,_7>,_0>
                *)&local_4770);
    local_4770.m_lhs.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[lVar9] * (double)(&w_i)[lVar9] * local_4738);
    Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&local_3680,
               (Scalar *)&local_4770);
    this_00 = local_4740;
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              (local_4740,(MatrixBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&local_3680);
    local_4770.m_lhs.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[lVar9] * (double)(&w_i)[lVar9] * local_4738);
    Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&local_2480,
               (Scalar *)&local_4770);
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              (this_00,(MatrixBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&local_2480);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4680);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero(local_4200);
    lVar9 = 8;
    lVar4 = 4;
    uVar6 = 0;
    while( true ) {
      pLVar1 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x28) <= uVar6
         ) break;
      std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_4750,
                   (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2> *
                   )((long)&pLVar1->m_element + lVar9));
      std::__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_4770,
                 &((local_4750._M_ptr)->damping).
                  super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>);
      LVar3.m_matrix = local_4770.m_lhs.m_lhs.m_matrix;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4770.m_lhs.m_rhs);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4750._M_refcount);
      if (LVar3.m_matrix != (non_const_type)0x0) {
        std::__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_4750,
                     (__shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                      *)((long)&((this->m_layers).
                                 super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_element + lVar9));
        std::__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_4770,
                   &((local_4750._M_ptr)->damping).
                    super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>);
        local_46c8 = 0xc;
        local_46c0 = 0xc;
        local_46b8 = 0xc;
        pdVar2 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_46d0 = (MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4200;
        (**(code **)((long)((local_4770.m_lhs.m_lhs.m_matrix)->
                           super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>).
                           m_storage.m_data.array[0] + 0x18))
                  (pdVar2[uVar6],pdVar2[uVar6 + 1],
                   (&((this->m_layers).
                      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_element)[lVar4],
                   local_4770.m_lhs.m_lhs.m_matrix,&local_46d0,&VNULL,&VNULL,&VNULL,&VNULL);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4770.m_lhs.m_rhs);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4750._M_refcount);
        Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_4680,
                   (MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_4200);
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 5;
      lVar9 = lVar9 + 0x28;
    }
    local_4770.m_lhs.m_rhs = (RhsNested)local_4680;
    local_4770.m_lhs.m_lhs.m_matrix = local_4758;
    local_4770.m_rhs = local_4758;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,24,1,12,24>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,0>>
              ((Matrix<double,_24,_24,_1,_24,_24> *)local_1280,&local_4770);
    lVar9 = local_4730;
    local_4770.m_lhs.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[local_4730] * (double)(&w_i)[local_4730] * local_4728);
    Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
              (local_1280,(Scalar *)&local_4770);
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              (local_4740,(MatrixBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1280);
  }
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    m_JacobianMatrix.setZero();

    // tangente

    ChMatrixNM<double, 24, 24> Kg;
    ChMatrixNM<double, 24, 24> Km;
	ChMatrixNM<double, 24, 24> Rm;
    ChMatrixNM<double, IDOFS, 24> K_beta_q;
    ChMatrixNM<double, IDOFS, IDOFS> K_beta_beta;

    for (int i = 0; i < NUMIP; i++) {
        // GEOMETRIC STIFFNESS Kg:

        Kg = D_overline_i[i].transpose() * G_i[i] * D_overline_i[i];

        // MATERIAL STIFFNESS Km:

        ChMatrixNM<double, 12, 12> C;
        ChMatrixNM<double, 12, 12> l_C;
        C.setZero();
        l_C.setZero();
        // loop on layers
        for (size_t il = 0; il < m_layers.size(); ++il) {
            // compute layer tang. material stiff, and accumulate
            m_layers[il].GetMaterial()->ComputeStiffnessMatrix(
                l_C, eps_tilde_1_i[i], eps_tilde_2_i[i], k_tilde_1_i[i], k_tilde_2_i[i], m_layers_z[il],
                m_layers_z[il + 1],
                m_layers[il].Get_theta());  // ***TODO*** use the total epsilon including the 'hat' component from EAS
            C += l_C;
        }

        Km = B_overline_i[i].transpose() * C * B_overline_i[i];

        // EAS STIFFNESS K_beta_q:
        K_beta_q = P_i[i].transpose() * C * B_overline_i[i];

        // EAS STIFFNESS K_beta_beta:
        K_beta_beta = P_i[i].transpose() * C * P_i[i];

        // Assembly the entire jacobian
        //  [ Km   Kbq' ]
        //  [ Kbq  Kbb  ]

        double dCoef = 1.0;  //***TODO*** autoset this

		Km *= (alpha_i[i] * w_i[i] * dCoef * Kfactor); // was: ... * dCoef * (Kfactor+Rfactor * m_Alpha));
        m_JacobianMatrix += Km;

#ifdef CHUSE_KGEOMETRIC
        Kg *= (alpha_i[i] * w_i[i] * dCoef * Kfactor);
        m_JacobianMatrix += Kg;
#endif

#ifdef CHUSE_EAS
        K_beta_q *= (alpha_i[i] * w_i[i] * Kfactor);
        K_beta_beta *= (alpha_i[i] * (w_i[i] / dCoef) * Kfactor);

        m_JacobianMatrix.block(24, 0, 7, 24) += K_beta_q;
        m_JacobianMatrix.block(0, 24, 24, 7) += K_beta_q.transpose();
        m_JacobianMatrix.block(24, 4, 7, 7) += K_beta_beta;
#endif

		// Damping matrix 

		C.setZero();
        l_C.setZero();
        // loop on layers
        for (size_t il = 0; il < m_layers.size(); ++il) {
            // compute layer damping matrix
			if (m_layers[il].GetMaterial()->GetDamping()) {
				m_layers[il].GetMaterial()->GetDamping()->ComputeDampingMatrix(
					l_C, 
					VNULL, VNULL, VNULL, VNULL, //***TODO*** should be more general: eps_dt_tilde_1_i[i], eps_dt_tilde_2_i[i], k_dt_tilde_1_i[i], k_dt_tilde_2_i[i], 
					m_layers_z[il],
					m_layers_z[il + 1],
					m_layers[il].Get_theta());  
				C += l_C;
			}
        }
		Rm = B_overline_i[i].transpose() * C * B_overline_i[i];
		Rm *= (alpha_i[i] * w_i[i] * dCoef * Rfactor);
        m_JacobianMatrix += Rm;
    }
}